

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void __thiscall btLCP::transfer_i_to_C(btLCP *this,int i)

{
  int iVar1;
  btScalar *pbVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int nC;
  long lVar8;
  float fVar9;
  int in_stack_fffffffffffffff0;
  
  iVar1 = this->m_nC;
  lVar8 = (long)iVar1;
  if (lVar8 < 1) {
    *this->m_d = 1.0 / this->m_A[i][i];
  }
  else {
    iVar7 = this->m_nskip;
    pbVar2 = this->m_L;
    pfVar3 = this->m_ell;
    lVar5 = 0;
    do {
      pbVar2[iVar7 * lVar8 + lVar5] = pfVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar8 != lVar5);
    pfVar4 = this->m_Dell;
    uVar6 = iVar1 - 2;
    fVar9 = 0.0;
    iVar7 = iVar1;
    if (iVar1 != 1) {
      do {
        fVar9 = pfVar3[1] * pfVar4[1] + *pfVar3 * *pfVar4 + fVar9;
        pfVar3 = pfVar3 + 2;
        pfVar4 = pfVar4 + 2;
        iVar7 = iVar7 + -2;
      } while (1 < iVar7);
      uVar6 = (iVar1 - (uVar6 & 0xfffffffe)) - 4;
    }
    if (uVar6 == 0xffffffff) {
      fVar9 = fVar9 + *pfVar3 * *pfVar4;
    }
    this->m_d[lVar8] = 1.0 / (this->m_A[i][i] - fVar9);
  }
  btSwapProblem(this->m_A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,
                this->m_state,this->m_findex,this->m_n,iVar1,i,1,in_stack_fffffffffffffff0);
  iVar1 = this->m_nC;
  this->m_C[iVar1] = iVar1;
  this->m_nC = iVar1 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_to_C (int i)
{
  {
    if (m_nC > 0) {
      // ell,Dell were computed by solve1(). note, ell = D \ L1solve (L,A(i,C))
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip, *ell = m_ell;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nC = nC + 1; // nC value is outdated after this line
  }

}